

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

void __thiscall
wasm::SExpressionWasmBuilder::parseElem(SExpressionWasmBuilder *this,Element *s,Table *table)

{
  int iVar1;
  pointer puVar2;
  _Head_base<0UL,_wasm::Table_*,_false> _Var3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  Const *this_00;
  __uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true> _Var7
  ;
  Element *pEVar8;
  size_t sVar9;
  Expression *pEVar10;
  Type TVar11;
  string *psVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *this_01;
  undefined1 uVar13;
  uint i;
  IString IVar14;
  IString str;
  IString str_00;
  string local_c0 [32];
  string local_a0 [32];
  anon_union_16_5_9943fe1e_for_Literal_0 local_80;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string_view local_50;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_40;
  __single_object segment_1;
  __single_object segment;
  
  iVar1 = this->elemCounter;
  this->elemCounter = iVar1 + 1;
  local_50 = (string_view)Name::fromInt((long)iVar1);
  if (table != (Table *)0x0) {
    this_00 = MixedArena::alloc<wasm::Const>(this->allocator);
    local_80.i32 = 0;
    local_70 = 2;
    _Var7.super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
         (__uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>)
         Const::set(this_00,(Literal *)&local_80.func);
    Literal::~Literal((Literal *)&local_80.func);
    segment_1._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
          )(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
            )_Var7.
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    std::make_unique<wasm::ElementSegment,wasm::Name&,wasm::Expression*&>
              ((Name *)&stack0xffffffffffffffc0,(Expression **)table);
    ((local_40._M_head_impl)->super_Named).name.super_IString.str._M_len = local_50._M_len;
    ((local_40._M_head_impl)->super_Named).name.super_IString.str._M_str = local_50._M_str;
    ((local_40._M_head_impl)->super_Named).hasExplicitName = false;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              (&this->elemSegmentNames,(value_type *)&local_50);
    pEVar8 = Element::operator[](s,1);
    parseElemFinish(this,s,(unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            *)&stack0xffffffffffffffc0,1,pEVar8->isList_);
    this_01 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
              &stack0xffffffffffffffc0;
    goto LAB_00a12ac6;
  }
  i = 1;
  pEVar8 = Element::operator[](s,1);
  if (pEVar8->isList_ == false) {
    pEVar8 = Element::operator[](s,1);
    uVar13 = 0;
    if ((pEVar8->isList_ == false) && (uVar13 = 0, (pEVar8->dollared_ & 1U) != 0)) {
      pEVar8 = Element::operator[](s,1);
      local_50 = (string_view)Element::str(pEVar8);
      i = 2;
      uVar13 = 1;
    }
  }
  else {
    uVar13 = 0;
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->elemSegmentNames,(value_type *)&local_50);
  pEVar8 = Element::operator[](s,i);
  if (pEVar8->isList_ == false) {
    pEVar8 = Element::operator[](s,i);
    IVar14 = Element::str(pEVar8);
    if (IVar14.str._M_str == (char *)DECLARE._8_8_) {
      return;
    }
  }
  std::make_unique<wasm::ElementSegment>();
  *(size_t *)
   segment_1._M_t.
   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
   super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = local_50._M_len;
  *(char **)((long)segment_1._M_t.
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 8) =
       local_50._M_str;
  *(undefined1 *)
   ((long)segment_1._M_t.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x10) = uVar13;
  pEVar8 = Element::operator[](s,i);
  bVar6 = true;
  if (pEVar8->isList_ == true) {
    pEVar8 = Element::operator[](s,i);
    IVar14.str._M_str = extraout_RDX;
    IVar14.str._M_len = DAT_00e63cc8;
    bVar5 = elementStartsWith(pEVar8,IVar14);
    if (!bVar5) {
      pEVar8 = Element::operator[](s,i);
      str.str._M_str = extraout_RDX_00;
      str.str._M_len = TABLE._8_8_;
      bVar6 = elementStartsWith(pEVar8,str);
      if (bVar6) {
        pEVar8 = Element::operator[](s,i);
        pEVar8 = Element::operator[](pEVar8,1);
        IVar14.str = (string_view)getTableName(this,pEVar8);
        i = i + 1;
        ((IString *)
        ((long)segment_1._M_t.
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x18))->str =
             IVar14.str;
      }
      pEVar8 = Element::operator[](s,i);
      str_00.str._M_str = extraout_RDX_01;
      str_00.str._M_len = OFFSET._8_8_;
      bVar6 = elementStartsWith(pEVar8,str_00);
      if (bVar6) {
        sVar9 = Element::size(pEVar8);
        if (2 < sVar9) {
          psVar12 = (string *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_c0,"Invalid offset for an element segment.",
                     (allocator<char> *)&stack0xffffffffffffffc0);
          local_68 = s->line;
          uStack_60 = s->col;
          std::__cxx11::string::string(psVar12,local_c0);
          *(undefined4 *)(psVar12 + 0x20) = (undefined4)local_68;
          *(undefined4 *)(psVar12 + 0x24) = local_68._4_4_;
          *(undefined4 *)(psVar12 + 0x28) = (undefined4)uStack_60;
          *(undefined4 *)(psVar12 + 0x2c) = uStack_60._4_4_;
          __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
        }
        pEVar8 = Element::operator[](pEVar8,1);
      }
      pEVar10 = parseExpression(this,pEVar8);
      i = i + 1;
      *(Expression **)
       ((long)segment_1._M_t.
              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28) = pEVar10;
      bVar6 = false;
    }
  }
  sVar9 = Element::size(s);
  if ((i < sVar9) &&
     (((pEVar8 = Element::operator[](s,i), pEVar8->isList_ != false ||
       (pEVar8 = Element::operator[](s,i), pEVar8->isList_ != false)) ||
      ((pEVar8->dollared_ & 1U) == 0)))) {
    pEVar8 = Element::operator[](s,i);
    if (pEVar8->isList_ == false) {
      pEVar8 = Element::operator[](s,i);
      IVar14 = Element::str(pEVar8);
      if (IVar14.str._M_str == DAT_00e63bd8) {
        i = i + 1;
        goto LAB_00a12a68;
      }
    }
    pEVar8 = Element::operator[](s,i);
    TVar11 = elementToType(this,pEVar8);
    *(uintptr_t *)
     ((long)segment_1._M_t.
            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
            _M_t.
            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x30) = TVar11.id;
    i = i + 1;
    bVar5 = true;
  }
  else {
LAB_00a12a68:
    bVar5 = false;
  }
  if ((!bVar6) &&
     (*(long *)((long)segment_1._M_t.
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x20) ==
      0)) {
    puVar2 = (this->wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar2 == (this->wasm->tables).
                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      psVar12 = (string *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a0,"active element without table",(allocator<char> *)&stack0xffffffffffffffc0
                );
      local_68 = s->line;
      uStack_60 = s->col;
      std::__cxx11::string::string(psVar12,local_a0);
      *(undefined4 *)(psVar12 + 0x20) = (undefined4)local_68;
      *(undefined4 *)(psVar12 + 0x24) = local_68._4_4_;
      *(undefined4 *)(psVar12 + 0x28) = (undefined4)uStack_60;
      *(undefined4 *)(psVar12 + 0x2c) = uStack_60._4_4_;
      __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
    }
    _Var3._M_head_impl =
         (puVar2->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    pcVar4 = *(char **)((long)&(_Var3._M_head_impl)->super_Importable + 8);
    *(undefined8 *)
     ((long)segment_1._M_t.
            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
            _M_t.
            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x18) =
         *(undefined8 *)&(_Var3._M_head_impl)->super_Importable;
    *(char **)((long)segment_1._M_t.
                     super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x20) =
         pcVar4;
  }
  bVar6 = true;
  if (!bVar5) {
    bVar6 = TableUtils::usesExpressions
                      ((ElementSegment *)
                       segment_1._M_t.
                       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                       .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl,this->wasm
                      );
  }
  parseElemFinish(this,s,&segment_1,i,bVar6);
  this_01 = &segment_1;
LAB_00a12ac6:
  std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
            (this_01);
  return;
}

Assistant:

void SExpressionWasmBuilder::parseElem(Element& s, Table* table) {
  Index i = 1;
  Name name = Name::fromInt(elemCounter++);
  bool hasExplicitName = false;
  bool isPassive = true;
  bool usesExpressions = false;

  if (table) {
    Expression* offset = allocator.alloc<Const>()->set(Literal(int32_t(0)));
    auto segment = std::make_unique<ElementSegment>(table->name, offset);
    segment->setName(name, hasExplicitName);
    elemSegmentNames.push_back(name);
    parseElemFinish(s, segment, i, s[i]->isList());
    return;
  }

  if (s[i]->isStr() && s[i]->dollared()) {
    name = s[i++]->str();
    hasExplicitName = true;
  }
  elemSegmentNames.push_back(name);
  if (s[i]->isStr() && s[i]->str() == DECLARE) {
    // We don't store declared segments in the IR
    return;
  }

  auto segment = std::make_unique<ElementSegment>();
  segment->setName(name, hasExplicitName);

  if (s[i]->isList() && !elementStartsWith(s[i], REF)) {
    // Optional (table <tableidx>)
    if (elementStartsWith(s[i], TABLE)) {
      auto& inner = *s[i++];
      segment->table = getTableName(*inner[1]);
    }

    // Offset expression (offset (<expr>)) | (<expr>)
    auto& inner = *s[i++];
    if (elementStartsWith(inner, OFFSET)) {
      if (inner.size() > 2) {
        throw ParseException(
          "Invalid offset for an element segment.", s.line, s.col);
      }
      segment->offset = parseExpression(inner[1]);
    } else {
      segment->offset = parseExpression(inner);
    }
    isPassive = false;
  }

  if (i < s.size()) {
    if (s[i]->isStr() && s[i]->dollared()) {
      usesExpressions = false;
    } else if (s[i]->isStr() && s[i]->str() == FUNC) {
      usesExpressions = false;
      i += 1;
    } else {
      segment->type = elementToType(*s[i]);
      usesExpressions = true;
      i += 1;
    }
  }

  if (!isPassive && segment->table.isNull()) {
    if (wasm.tables.empty()) {
      throw ParseException("active element without table", s.line, s.col);
    }
    table = wasm.tables.front().get();
    segment->table = table->name;
  }

  // We may be post-MVP also due to type reasons or otherwise, as detected by
  // the utility function for Binaryen IR.
  usesExpressions =
    usesExpressions || TableUtils::usesExpressions(segment.get(), &wasm);

  parseElemFinish(s, segment, i, usesExpressions);
}